

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_new.c
# Opt level: O1

LY_ERR lyd_change_term_val(lyd_node *term,lyd_value *val,ly_bool use_val,ly_bool is_dflt)

{
  lyd_node *plVar1;
  uint uVar2;
  lysc_node *plVar3;
  lysc_node *plVar4;
  lyd_node_inner *plVar5;
  lyd_node *plVar6;
  char *pcVar7;
  ly_bool lVar8;
  uint16_t uVar9;
  int iVar10;
  LY_ERR LVar11;
  LY_ERR LVar12;
  lys_module *plVar13;
  lyd_node_inner *plVar14;
  lyd_node_term *in_stack_ffffffffffffffb8;
  lyd_node_inner *local_38;
  
  plVar3 = term->schema;
  plVar4 = plVar3[1].parent;
  if (plVar3 == (lysc_node *)0x0) {
    plVar13 = (lys_module *)&term[2].schema;
  }
  else {
    plVar13 = plVar3->module;
  }
  plVar1 = term + 1;
  iVar10 = (*(code *)plVar4->parent->next)(plVar13->ctx,plVar1,val);
  if (iVar10 == 0) {
    if (use_val != '\0') {
      if (term->schema == (lysc_node *)0x0) {
        plVar13 = (lys_module *)&term[2].schema;
      }
      else {
        plVar13 = term->schema->module;
      }
      (*(code *)plVar4->parent->ref)(plVar13->ctx,val);
    }
  }
  else {
    if ((is_dflt != '\0') && ((term->flags & 1) != 0)) {
      __assert_fail("!(term->flags & LYD_DEFAULT) || !is_dflt",
                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data_new.c"
                    ,0x52d,
                    "LY_ERR lyd_change_term_val(struct lyd_node *, struct lyd_value *, ly_bool, ly_bool)"
                   );
    }
    plVar3 = term->schema;
    plVar14 = (lyd_node_inner *)term;
    if ((plVar3->nodetype == 8) ||
       (((plVar3->flags & 0x100) != 0 && (plVar14 = term->parent, plVar14 != (lyd_node_inner *)0x0))
       )) {
      plVar5 = (lyd_node_inner *)(plVar14->field_0).node.prev;
      if ((plVar5 == plVar14) ||
         (((plVar3 = (plVar14->field_0).node.schema, (plVar5->field_0).node.schema != plVar3 &&
           ((plVar6 = (plVar14->field_0).node.next, plVar6 == (lyd_node *)0x0 ||
            (plVar3 != plVar6->schema)))) ||
          (lVar8 = lyds_is_supported((lyd_node *)plVar14), lVar8 == '\0')))) {
        lyd_unlink_hash((lyd_node *)in_stack_ffffffffffffffb8);
        if (term->schema == (lysc_node *)0x0) {
          plVar13 = (lys_module *)&term[2].schema;
        }
        else {
          plVar13 = term->schema->module;
        }
        (*(code *)(term[1].schema)->parent->ref)(plVar13->ctx,plVar1);
        if (use_val == '\0') {
          plVar3 = term->schema;
          if (plVar3 == (lysc_node *)0x0) {
            plVar13 = (lys_module *)&term[2].schema;
          }
          else {
            plVar13 = plVar3->module;
          }
          (*(code *)(plVar3[1].parent)->parent->dsc)(plVar13->ctx,val,plVar1);
        }
        else {
          term[1].prev = *(lyd_node **)((long)&val->field_2 + 0x10);
          pcVar7 = val->_canonical;
          plVar3 = (lysc_node *)val->realtype;
          plVar6 = *(lyd_node **)((long)&val->field_2 + 8);
          term[1].parent = (lyd_node_inner *)(val->field_2).dec64;
          term[1].next = plVar6;
          *(char **)plVar1 = pcVar7;
          term[1].schema = plVar3;
        }
      }
      else {
        local_38 = (lyd_node_inner *)lyd_first_sibling((lyd_node *)plVar14);
        if (local_38 == plVar14) {
          local_38 = (lyd_node_inner *)(local_38->field_0).node.next;
        }
        lyd_unlink_tree((lyd_node *)plVar14);
        if (term->schema == (lysc_node *)0x0) {
          plVar13 = (lys_module *)&term[2].schema;
        }
        else {
          plVar13 = term->schema->module;
        }
        (*(code *)(term[1].schema)->parent->ref)(plVar13->ctx,plVar1);
        if (use_val == '\0') {
          plVar3 = term->schema;
          if (plVar3 == (lysc_node *)0x0) {
            plVar13 = (lys_module *)&term[2].schema;
          }
          else {
            plVar13 = plVar3->module;
          }
          (*(code *)(plVar3[1].parent)->parent->dsc)(plVar13->ctx,val,plVar1);
        }
        else {
          term[1].prev = *(lyd_node **)((long)&val->field_2 + 0x10);
          pcVar7 = val->_canonical;
          plVar3 = (lysc_node *)val->realtype;
          plVar6 = *(lyd_node **)((long)&val->field_2 + 8);
          term[1].parent = (lyd_node_inner *)(val->field_2).dec64;
          term[1].next = plVar6;
          *(char **)plVar1 = pcVar7;
          term[1].schema = plVar3;
        }
        lyd_insert_node((lyd_node *)0x0,(lyd_node **)&local_38,(lyd_node *)plVar14,0);
      }
      lyd_hash((lyd_node *)plVar14);
      LVar11 = lyd_insert_hash((lyd_node *)plVar14);
    }
    else {
      (*(code *)(term[1].schema)->parent->ref)(plVar3->module->ctx,plVar1);
      if (use_val == '\0') {
        plVar3 = term->schema;
        if (plVar3 == (lysc_node *)0x0) {
          plVar13 = (lys_module *)&term[2].schema;
        }
        else {
          plVar13 = plVar3->module;
        }
        LVar11 = (*(code *)(plVar3[1].parent)->parent->dsc)(plVar13->ctx,val,plVar1);
      }
      else {
        term[1].prev = *(lyd_node **)((long)&val->field_2 + 0x10);
        pcVar7 = val->_canonical;
        plVar3 = (lysc_node *)val->realtype;
        plVar6 = *(lyd_node **)((long)&val->field_2 + 8);
        term[1].parent = (lyd_node_inner *)(val->field_2).dec64;
        term[1].next = plVar6;
        *(char **)plVar1 = pcVar7;
        term[1].schema = plVar3;
        LVar11 = LY_SUCCESS;
      }
    }
    if (LVar11 != LY_SUCCESS) {
      return LVar11;
    }
  }
  if (iVar10 != 0) {
    if (term->schema == (lysc_node *)0x0) {
      plVar13 = (lys_module *)&term[2].schema;
    }
    else {
      plVar13 = term->schema->module;
    }
    uVar9 = ly_ctx_get_options(plVar13->ctx);
    if ((uVar9 >> 10 & 1) != 0) {
      lyd_free_leafref_nodes(in_stack_ffffffffffffffb8);
    }
    *(byte *)&term->flags = (byte)term->flags | 4;
  }
  uVar2 = term->flags;
  if (is_dflt == '\0' && (uVar2 & 1) != 0) {
    term->flags = uVar2 & 0xfffffffe;
    if (term == (lyd_node *)0x0) {
      plVar14 = (lyd_node_inner *)0x0;
    }
    else {
      plVar14 = term->parent;
    }
    lyd_np_cont_dflt_del((lyd_node *)plVar14);
  }
  else {
    LVar11 = LY_ENOT;
    if ((uVar2 & 1) != 0 || is_dflt == '\0') goto LAB_0012e442;
    term->flags = uVar2 | 1;
    if (term == (lyd_node *)0x0) {
      plVar14 = (lyd_node_inner *)0x0;
    }
    else {
      plVar14 = term->parent;
    }
    lyd_np_cont_dflt_set((lyd_node *)plVar14);
  }
  LVar11 = LY_EEXIST;
LAB_0012e442:
  LVar12 = LY_SUCCESS;
  if (iVar10 == 0) {
    LVar12 = LVar11;
  }
  return LVar12;
}

Assistant:

LY_ERR
lyd_change_term_val(struct lyd_node *term, struct lyd_value *val, ly_bool use_val, ly_bool is_dflt)
{
    LY_ERR rc = LY_SUCCESS;
    struct lysc_type *type;
    struct lyd_node_term *t;
    ly_bool dflt_change, val_change;

    t = (struct lyd_node_term *)term;
    type = ((struct lysc_node_leaf *)term->schema)->type;

    /* compare original and new value */
    if (type->plugin->compare(LYD_CTX(term), &t->value, val)) {
        /* since they are different, they cannot both be default */
        assert(!(term->flags & LYD_DEFAULT) || !is_dflt);

        /* values differ, switch them */
        LY_CHECK_RET(lyd_change_node_value(t, val, use_val));
        val_change = 1;
    } else {
        /* same values, free the new stored one */
        if (use_val) {
            type->plugin->free(LYD_CTX(term), val);
        }
        val_change = 0;
    }

    /* clear links to leafref nodes */
    if (val_change && (ly_ctx_get_options(LYD_CTX(term)) & LY_CTX_LEAFREF_LINKING)) {
        lyd_free_leafref_nodes(t);
    }

    /* update flags */
    if (val_change) {
        term->flags |= LYD_NEW;
    }
    if ((term->flags & LYD_DEFAULT) && !is_dflt) {
        /* remove dflt flag */
        term->flags &= ~LYD_DEFAULT;

        /* remove parent dflt flag */
        lyd_np_cont_dflt_del(lyd_parent(term));

        dflt_change = 1;
    } else if (!(term->flags & LYD_DEFAULT) && is_dflt) {
        /* add dflt flag */
        term->flags |= LYD_DEFAULT;

        /* add parent dflt flag */
        lyd_np_cont_dflt_set(lyd_parent(term));

        dflt_change = 1;
    } else {
        dflt_change = 0;
    }

    if (!val_change) {
        /* only default flag change or no change */
        rc = dflt_change ? LY_EEXIST : LY_ENOT;
    } /* else value changed, LY_SUCCESS */

    return rc;
}